

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O1

void __thiscall
leveldb::VersionEdit::SetCompactPointer(VersionEdit *this,int level,InternalKey *key)

{
  pointer pcVar1;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  char local_20 [16];
  
  pcVar1 = (key->rep_)._M_dataplus._M_p;
  local_38._0_4_ = level;
  local_30._M_p = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + (key->rep_)._M_string_length);
  std::
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>::
  emplace_back<std::pair<int,leveldb::InternalKey>>
            ((vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
              *)&this->compact_pointers_,(pair<int,_leveldb::InternalKey> *)local_38);
  if (local_30._M_p != local_20) {
    operator_delete(local_30._M_p);
  }
  return;
}

Assistant:

void SetCompactPointer(int level, const InternalKey& key) {
    compact_pointers_.push_back(std::make_pair(level, key));
  }